

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O3

void __thiscall TPZMGAnalysis::TPZMGAnalysis(TPZMGAnalysis *this,TPZCompMesh *cmesh)

{
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_0196b740,cmesh,true,(ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZMGAnalysis_0196b630;
  TPZVec<TPZCompMesh_*>::TPZVec((TPZVec<TPZCompMesh_*> *)&this->fMeshes,0);
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fStore =
       (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.fExtAlloc;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01920b48;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fStore = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.fExtAlloc;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fNElements = 0;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fNAlloc = 0;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0196ba80;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01822c80;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01822c80;
  TPZManVector<TPZCompMesh_*,_10>::Resize(&(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>,1);
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fStore
  [(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements + -1
  ] = cmesh;
  return;
}

Assistant:

TPZMGAnalysis::TPZMGAnalysis(TPZCompMesh *cmesh) : TPZLinearAnalysis(cmesh) {
	fMeshes.Push(cmesh);
}